

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>(InternalMetadata *this)

{
  InternalMetadata *in_RDI;
  InternalMetadata *unaff_retaddr;
  
  if (((uint)in_RDI->ptr_ & 1) == 1) {
    PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>(in_RDI);
  }
  else {
    mutable_unknown_fields_slow<std::__cxx11::string>(unaff_retaddr);
  }
  std::__cxx11::string::clear();
  return;
}

Assistant:

inline void InternalMetadata::DoClear<std::string>() {
  mutable_unknown_fields<std::string>()->clear();
}